

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.hpp
# Opt level: O0

char * trial::protocol::json::detail::scan_digit<char>(char *marker,char *tail)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  uint x;
  int iVar6;
  byte bVar7;
  int mask;
  __m128i data;
  __m128i legal;
  __m128i offset;
  char *tail_local;
  char *marker_local;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  
  tail_local = marker;
  while( true ) {
    if ((long)tail - (long)tail_local < 0x11) {
      while ((tail_local != tail && (bVar5 = traits::is_digit<char>(*tail_local), bVar5))) {
        tail_local = tail_local + 1;
      }
      return tail_local;
    }
    uVar1 = *(undefined8 *)tail_local;
    uVar2 = *(undefined8 *)(tail_local + 8);
    local_a8 = (char)uVar1;
    cStack_a7 = (char)((ulong)uVar1 >> 8);
    cStack_a6 = (char)((ulong)uVar1 >> 0x10);
    cStack_a5 = (char)((ulong)uVar1 >> 0x18);
    cStack_a4 = (char)((ulong)uVar1 >> 0x20);
    cStack_a3 = (char)((ulong)uVar1 >> 0x28);
    cStack_a2 = (char)((ulong)uVar1 >> 0x30);
    cStack_a1 = (char)((ulong)uVar1 >> 0x38);
    cStack_a0 = (char)uVar2;
    cStack_9f = (char)((ulong)uVar2 >> 8);
    cStack_9e = (char)((ulong)uVar2 >> 0x10);
    cStack_9d = (char)((ulong)uVar2 >> 0x18);
    cStack_9c = (char)((ulong)uVar2 >> 0x20);
    cStack_9b = (char)((ulong)uVar2 >> 0x28);
    cStack_9a = (char)((ulong)uVar2 >> 0x30);
    cStack_99 = (char)((ulong)uVar2 >> 0x38);
    bVar7 = -((char)(cStack_99 + 'F') < 'u');
    auVar4[1] = -((char)(cStack_a7 + 'F') < 'u');
    auVar4[0] = -((char)(local_a8 + 'F') < 'u');
    auVar4[2] = -((char)(cStack_a6 + 'F') < 'u');
    auVar4[3] = -((char)(cStack_a5 + 'F') < 'u');
    auVar4[4] = -((char)(cStack_a4 + 'F') < 'u');
    auVar4[5] = -((char)(cStack_a3 + 'F') < 'u');
    auVar4[6] = -((char)(cStack_a2 + 'F') < 'u');
    auVar4[7] = -((char)(cStack_a1 + 'F') < 'u');
    uVar3 = CONCAT17(bVar7,CONCAT16(-((char)(cStack_9a + 'F') < 'u'),
                                    CONCAT15(-((char)(cStack_9b + 'F') < 'u'),
                                             CONCAT14(-((char)(cStack_9c + 'F') < 'u'),
                                                      CONCAT13(-((char)(cStack_9d + 'F') < 'u'),
                                                               CONCAT12(-((char)(cStack_9e + 'F') <
                                                                         'u'),CONCAT11(-((char)(
                                                  cStack_9f + 'F') < 'u'),
                                                  -((char)(cStack_a0 + 'F') < 'u'))))))));
    auVar4._8_8_ = uVar3;
    x = (uint)(ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                       (ushort)((byte)(uVar3 >> 7) & 1) << 8 |
                       (ushort)((byte)(uVar3 >> 0xf) & 1) << 9 |
                       (ushort)((byte)(uVar3 >> 0x17) & 1) << 10 |
                       (ushort)((byte)(uVar3 >> 0x1f) & 1) << 0xb |
                       (ushort)((byte)(uVar3 >> 0x27) & 1) << 0xc |
                       (ushort)((byte)(uVar3 >> 0x2f) & 1) << 0xd |
                       (ushort)((byte)(uVar3 >> 0x37) & 1) << 0xe | (ushort)(bVar7 >> 7) << 0xf);
    if (x != 0) break;
    tail_local = tail_local + 0x10;
  }
  iVar6 = core::detail::countr_zero<int>(x);
  return tail_local + iVar6;
}

Assistant:

auto scan_digit(const CharT *marker,
                const CharT * const tail) noexcept -> const CharT *
{
#if defined(TRIAL_PROTOCOL_USE_SSE2)
    // Shift digits to range [0x75, 0x7F] to make single range comparison
    const auto offset = _mm_set1_epi8(0x7F - 0x39);
    const auto legal = _mm_set1_epi8(0x7F - 10);
    while (tail - marker > 16)
    {
        auto data = _mm_loadu_si128((const __m128i *)marker);
        data = _mm_add_epi8(data, offset);
        data = _mm_cmplt_epi8(data, legal);
        const auto mask = _mm_movemask_epi8(data);
        if (mask != 0)
            return marker + core::detail::countr_zero(mask);
        marker += 16;
    }
#endif

    while (marker != tail)
    {
        if (traits::is_digit(*marker))
        {
            ++marker;
        }
        else
            break;
    }
    return marker;
}